

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-assertion-result.h
# Opt level: O0

AssertionResult * __thiscall
testing::AssertionResult::operator<<(AssertionResult *this,char (*value) [3])

{
  AssertionResult *in_RDI;
  Message *in_stack_00000008;
  AssertionResult *in_stack_00000010;
  char (*in_stack_ffffffffffffffd8) [3];
  
  Message::Message((Message *)in_stack_00000010);
  Message::operator<<((Message *)in_RDI,in_stack_ffffffffffffffd8);
  AppendMessage(in_stack_00000010,in_stack_00000008);
  Message::~Message((Message *)0x10c8c8);
  return in_RDI;
}

Assistant:

AssertionResult& operator<<(const T& value) {
    AppendMessage(Message() << value);
    return *this;
  }